

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

size_t __thiscall
AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize
          (AccountingTestMemoryAllocator *this,char *memory)

{
  _func_int **pp_Var1;
  size_t sVar2;
  AccountingTestMemoryAllocatorMemoryNode *pAVar3;
  AccountingTestMemoryAllocatorMemoryNode *pAVar4;
  TestMemoryAllocator *pTVar5;
  undefined8 uVar6;
  
  pAVar4 = this->head_;
  if (pAVar4 == (AccountingTestMemoryAllocatorMemoryNode *)0x0) {
    sVar2 = 0;
  }
  else {
    if (pAVar4->memory_ == memory) {
      this->head_ = pAVar4->next_;
      sVar2 = pAVar4->size_;
      pTVar5 = this->originalAllocator_;
      pp_Var1 = pTVar5->_vptr_TestMemoryAllocator;
      uVar6 = 0x292;
    }
    else {
      do {
        pAVar3 = pAVar4;
        pAVar4 = pAVar3->next_;
        if (pAVar4 == (AccountingTestMemoryAllocatorMemoryNode *)0x0) {
          return 0;
        }
      } while (pAVar4->memory_ != memory);
      pAVar3->next_ = pAVar4->next_;
      sVar2 = pAVar4->size_;
      pTVar5 = this->originalAllocator_;
      pp_Var1 = pTVar5->_vptr_TestMemoryAllocator;
      uVar6 = 0x288;
    }
    (*pp_Var1[3])(pTVar5,pAVar4,sVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                  ,uVar6);
  }
  return sVar2;
}

Assistant:

size_t AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize(char* memory)
{
    if (head_ && head_->memory_ == memory)
        return removeHeadAndReturnSize();

    for (AccountingTestMemoryAllocatorMemoryNode* node = head_; node; node = node->next_) {
        if (node->next_ && node->next_->memory_ == memory)
            return removeNextNodeAndReturnSize(node);
    }

    return 0;
}